

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

FTexture * __thiscall FFont::GetChar(FFont *this,int code,int *width)

{
  int iVar1;
  CharData *pCVar2;
  uint code_00;
  FTexture *pFVar3;
  uint uVar4;
  int iVar5;
  
  code_00 = GetCharCode(this,code,false);
  if ((int)code_00 < 0) {
    iVar5 = this->SpaceWidth;
    uVar4 = code_00;
  }
  else {
    iVar1 = this->FirstChar;
    uVar4 = code_00 - iVar1;
    pCVar2 = this->Chars;
    iVar5 = pCVar2[(int)uVar4].XMove;
    if ((pCVar2[(int)uVar4].Pic == (FTexture *)0x0) &&
       (uVar4 = GetCharCode(this,code_00,true), -1 < (int)uVar4)) {
      uVar4 = uVar4 - iVar1;
      iVar5 = pCVar2[(int)uVar4].XMove;
    }
  }
  if (width != (int *)0x0) {
    *width = iVar5;
  }
  if ((int)uVar4 < 0) {
    pFVar3 = (FTexture *)0x0;
  }
  else {
    pFVar3 = this->Chars[uVar4].Pic;
  }
  return pFVar3;
}

Assistant:

FTexture *FFont::GetChar (int code, int *const width) const
{
	code = GetCharCode(code, false);
	int xmove = SpaceWidth;

	if (code >= 0)
	{
		code -= FirstChar;
		xmove = Chars[code].XMove;
		if (Chars[code].Pic == NULL)
		{
			code = GetCharCode(code + FirstChar, true);
			if (code >= 0)
			{
				code -= FirstChar;
				xmove = Chars[code].XMove;
			}
		}
	}
	if (width != NULL)
	{
		*width = xmove;
	}
	return (code < 0) ? NULL : Chars[code].Pic;
}